

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::collect_changes
          (DynamicPartialIndex *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *sv,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uchar uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  iterator iVar6;
  Graph *pGVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  DynamicPartialIndex *pDVar13;
  uint *s;
  pointer puVar14;
  Graph *__args;
  
  this->back_ = 0;
  this->front_ = 0;
  puVar14 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (sv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pDVar13 = this;
  if (puVar14 != puVar3) {
    do {
      uVar2 = *puVar14;
      puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= (ulong)uVar2)
      goto LAB_0010c0f9;
      if ((puVar4[uVar2] != '\0') && (bVar8 = has_parent(pDVar13,uVar2,reverse_graph,dist), !bVar8))
      {
        uVar2 = *puVar14;
        uVar9 = this->back_;
        this->back_ = uVar9 + 1;
        puVar5 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->queue_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar5 >> 2) <= uVar9)
        goto LAB_0010c0f9;
        puVar5[uVar9] = uVar2;
        puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
            (ulong)*puVar14) goto LAB_0010c0f9;
        puVar4[*puVar14] = '?';
        pDVar13 = (DynamicPartialIndex *)this->updated_;
        iVar6._M_current = (uint *)pDVar13->graph_;
        if (iVar6._M_current == *(uint **)&pDVar13->k_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)pDVar13,iVar6,puVar14);
        }
        else {
          *iVar6._M_current = *puVar14;
          pDVar13->graph_ = (Graph *)(iVar6._M_current + 1);
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar3);
    uVar9 = this->back_;
    uVar11 = this->front_;
    if (uVar9 != this->front_) {
      do {
        uVar10 = uVar11 + 1;
        this->front_ = uVar10;
        puVar14 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->queue_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar14 >> 2) <= uVar11) {
LAB_0010c0f9:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        uVar12 = (ulong)puVar14[uVar11];
        pDVar13 = (DynamicPartialIndex *)
                  (graph->
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = ((long)(graph->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13 >> 3) *
                 -0x5555555555555555;
        if (uVar11 < uVar12 || uVar11 - uVar12 == 0) goto LAB_0010c0f9;
        __args = *(Graph **)
                  &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pDVar13->parent_)
                   [uVar12]._M_impl.super__Vector_impl_data;
        pGVar7 = (&pDVar13->graph_)[uVar12 * 3];
        if (__args != pGVar7) {
          do {
            uVar2 = *(uint *)&(__args->succ_).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(dist->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <=
                (ulong)uVar2) goto LAB_0010c0f9;
            uVar1 = puVar4[uVar2];
            if (((uVar1 != '\0') && (uVar1 != '?')) &&
               (bVar8 = has_parent(pDVar13,uVar2,reverse_graph,dist), !bVar8)) {
              uVar2 = *(uint *)&(__args->succ_).
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = this->back_;
              this->back_ = uVar9 + 1;
              puVar14 = (this->queue_->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->queue_->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar14 >> 2) <=
                  uVar9) goto LAB_0010c0f9;
              puVar14[uVar9] = uVar2;
              uVar9 = (ulong)*(uint *)&(__args->succ_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
              puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(dist->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= uVar9)
              goto LAB_0010c0f9;
              puVar4[uVar9] = '?';
              pDVar13 = (DynamicPartialIndex *)this->updated_;
              iVar6._M_current = (uint *)pDVar13->graph_;
              if (iVar6._M_current == *(uint **)&pDVar13->k_) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)pDVar13,iVar6,
                           (uint *)__args);
              }
              else {
                *iVar6._M_current =
                     *(uint *)&(__args->succ_).
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                pDVar13->graph_ = (Graph *)(iVar6._M_current + 1);
              }
            }
            __args = (Graph *)((long)&(__args->succ_).
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 4);
          } while (__args != pGVar7);
          uVar9 = this->back_;
          uVar10 = this->front_;
        }
        uVar11 = uVar10;
      } while (uVar9 != uVar10);
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::collect_changes(const std::vector<vertex_t> &sv,
                                                                 const std::vector<std::vector<vertex_t>> &graph,
                                                                 const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                                 std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    for (const auto &s : sv) {
        if (dist.at(s) > 0 && !has_parent(s, reverse_graph, dist)) {
            queue_.at(back_++) = s;
            dist.at(s) = INF8;
            updated_.push_back(s);
        }
    }
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8 && dist.at(nxt) > 0 && !has_parent(nxt, reverse_graph, dist)) {
                queue_.at(back_++) = nxt;
                dist.at(nxt) = INF8;
                updated_.push_back(nxt);
            }
        }
    }
}